

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O2

void BZ2_hbCreateDecodeTables
               (Int32 *limit,Int32 *base,Int32 *perm,UChar *length,Int32 minLen,Int32 maxLen,
               Int32 alphaSize)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar7 = 0;
  uVar9 = minLen;
  uVar3 = (ulong)(uint)alphaSize;
  if (alphaSize < 1) {
    uVar3 = uVar7;
  }
  for (; (int)uVar9 <= maxLen; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      if (uVar9 == length[uVar8]) {
        perm[(int)uVar7] = (Int32)uVar8;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
    }
  }
  for (lVar6 = 0; lVar6 != 0x17; lVar6 = lVar6 + 1) {
    base[lVar6] = 0;
  }
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    base[(ulong)length[uVar7] + 1] = base[(ulong)length[uVar7] + 1] + 1;
  }
  for (lVar6 = 1; lVar6 != 0x17; lVar6 = lVar6 + 1) {
    base[lVar6] = base[lVar6] + base[lVar6 + -1];
  }
  for (lVar6 = 0; lVar6 != 0x17; lVar6 = lVar6 + 1) {
    limit[lVar6] = 0;
  }
  iVar5 = 0;
  lVar4 = (long)minLen;
  for (lVar6 = lVar4; lVar6 <= maxLen; lVar6 = lVar6 + 1) {
    iVar1 = base[lVar6 + 1];
    iVar2 = base[lVar6];
    limit[lVar6] = (iVar1 - iVar2) + iVar5 + -1;
    iVar5 = (iVar5 + (iVar1 - iVar2)) * 2;
  }
  for (; lVar4 < maxLen; lVar4 = lVar4 + 1) {
    base[lVar4 + 1] = (limit[lVar4] * 2 - base[lVar4 + 1]) + 2;
  }
  return;
}

Assistant:

void BZ2_hbCreateDecodeTables ( Int32 *limit,
                                Int32 *base,
                                Int32 *perm,
                                UChar *length,
                                Int32 minLen,
                                Int32 maxLen,
                                Int32 alphaSize )
{
   Int32 pp, i, j, vec;

   pp = 0;
   for (i = minLen; i <= maxLen; i++)
      for (j = 0; j < alphaSize; j++)
         if (length[j] == i) { perm[pp] = j; pp++; };

   for (i = 0; i < BZ_MAX_CODE_LEN; i++) base[i] = 0;
   for (i = 0; i < alphaSize; i++) base[length[i]+1]++;

   for (i = 1; i < BZ_MAX_CODE_LEN; i++) base[i] += base[i-1];

   for (i = 0; i < BZ_MAX_CODE_LEN; i++) limit[i] = 0;
   vec = 0;

   for (i = minLen; i <= maxLen; i++) {
      vec += (base[i+1] - base[i]);
      limit[i] = vec-1;
      vec <<= 1;
   }
   for (i = minLen + 1; i <= maxLen; i++)
      base[i] = ((limit[i-1] + 1) << 1) - base[i];
}